

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  Descriptor *descriptor;
  FieldDescriptor *field;
  Descriptor *in_R8;
  long lVar2;
  int i;
  long lVar3;
  string sStack_68;
  string local_48;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&sStack_68,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "/**\n * Serializes the message to binary data (in protobuf wire format).\n * @return {!Uint8Array}\n */\n$class$.prototype.serializeBinary = function() {\n  var writer = new jspb.BinaryWriter();\n  $class$.serializeBinaryToWriter(this, writer);\n  return writer.getResultBuffer();\n};\n\n\n/**\n * Serializes the given message to binary data (in protobuf wire\n * format), writing to the given BinaryWriter.\n * @param {!$class$} message\n * @param {!jspb.BinaryWriter} writer\n */\n$class$.serializeBinaryToWriter = function(message, writer) {\n  var f = undefined;\n"
                     ,"class",&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(desc + 0x2c); lVar3 = lVar3 + 1) {
    field = (FieldDescriptor *)(*(long *)(desc + 0x30) + lVar2);
    bVar1 = anon_unknown_0::IgnoreField(field);
    if (!bVar1) {
      GenerateClassSerializeBinaryField
                ((Generator *)field,options,printer,
                 (FieldDescriptor *)(*(long *)(desc + 0x30) + lVar2));
    }
    lVar2 = lVar2 + 0xa8;
  }
  if (0 < *(int *)(desc + 0x68)) {
    descriptor = desc;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&sStack_68,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,descriptor);
    io::Printer::Print(printer,
                       "  jspb.Message.serializeBinaryExtensions(message, writer,\n    $extobj$Binary, $class$.prototype.getExtension);\n"
                       ,"extobj",&sStack_68,"class",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  io::Printer::Print(printer,"};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinary(const GeneratorOptions& options,
                                             io::Printer* printer,
                                             const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Serializes the message to binary data (in protobuf wire format).\n"
      " * @return {!Uint8Array}\n"
      " */\n"
      "$class$.prototype.serializeBinary = function() {\n"
      "  var writer = new jspb.BinaryWriter();\n"
      "  $class$.serializeBinaryToWriter(this, writer);\n"
      "  return writer.getResultBuffer();\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Serializes the given message to binary data (in protobuf wire\n"
      " * format), writing to the given BinaryWriter.\n"
      " * @param {!$class$} message\n"
      " * @param {!jspb.BinaryWriter} writer\n"
      " */\n"
      "$class$.serializeBinaryToWriter = function(message, "
      "writer) {\n"
      "  var f = undefined;\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassSerializeBinaryField(options, printer, desc->field(i));
    }
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.serializeBinaryExtensions(message, writer,\n"
        "    $extobj$Binary, $class$.prototype.getExtension);\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  }

  printer->Print(
      "};\n"
      "\n"
      "\n");
}